

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::PoolingParameter::InternalSwap(PoolingParameter *this,PoolingParameter *other)

{
  InternalMetadataWithArena *this_00;
  PoolingParameter *other_local;
  PoolingParameter *this_local;
  Container *local_30;
  
  std::swap<int>(&this->pool_,&other->pool_);
  std::swap<unsigned_int>(&this->kernel_size_,&other->kernel_size_);
  std::swap<unsigned_int>(&this->pad_,&other->pad_);
  std::swap<unsigned_int>(&this->kernel_h_,&other->kernel_h_);
  std::swap<unsigned_int>(&this->kernel_w_,&other->kernel_w_);
  std::swap<unsigned_int>(&this->stride_h_,&other->stride_h_);
  std::swap<unsigned_int>(&this->stride_w_,&other->stride_w_);
  std::swap<unsigned_int>(&this->pad_h_,&other->pad_h_);
  std::swap<unsigned_int>(&this->pad_w_,&other->pad_w_);
  std::swap<int>(&this->engine_,&other->engine_);
  std::swap<bool>(&this->global_pooling_,&other->global_pooling_);
  std::swap<unsigned_int>(&this->stride_,&other->stride_);
  std::swap<unsigned_int>((this->_has_bits_).has_bits_,(other->_has_bits_).has_bits_);
  this_00 = &other->_internal_metadata_;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) != 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) != 1) goto LAB_0079e9bd;
  }
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
               ::
               PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                         ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                           *)this_00);
  }
  else {
    local_30 = (Container *)
               google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap
            (&this->_internal_metadata_,&local_30->unknown_fields);
LAB_0079e9bd:
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void PoolingParameter::InternalSwap(PoolingParameter* other) {
  std::swap(pool_, other->pool_);
  std::swap(kernel_size_, other->kernel_size_);
  std::swap(pad_, other->pad_);
  std::swap(kernel_h_, other->kernel_h_);
  std::swap(kernel_w_, other->kernel_w_);
  std::swap(stride_h_, other->stride_h_);
  std::swap(stride_w_, other->stride_w_);
  std::swap(pad_h_, other->pad_h_);
  std::swap(pad_w_, other->pad_w_);
  std::swap(engine_, other->engine_);
  std::swap(global_pooling_, other->global_pooling_);
  std::swap(stride_, other->stride_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}